

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode
ParseVP8Header(uint8_t **data_ptr,size_t *data_size,int have_all_data,size_t riff_size,
              size_t *chunk_size,int *is_lossless)

{
  int *data_00;
  uint32_t uVar1;
  uint uVar2;
  ulong in_RCX;
  int in_EDX;
  ulong *in_RSI;
  long *in_RDI;
  ulong *in_R8;
  uint *in_R9;
  uint32_t size;
  uint32_t minimal_size;
  int is_vp8l;
  int is_vp8;
  uint8_t *data;
  undefined4 in_stack_ffffffffffffffb0;
  
  data_00 = (int *)*in_RDI;
  uVar2 = (uint)((*data_00 != 0x4c385056 ^ 0xffU) & 1);
  if (*in_RSI < 8) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  if ((*data_00 == 0x20385056) || (uVar2 != 0)) {
    uVar1 = GetLE32((uint8_t *)CONCAT44(0xc,in_stack_ffffffffffffffb0));
    if ((0xb < in_RCX) && (in_RCX - 0xc < (ulong)uVar1)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if ((in_EDX != 0) && (*in_RSI - 8 < (ulong)uVar1)) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    *in_R8 = (ulong)uVar1;
    *in_RDI = *in_RDI + 8;
    *in_RSI = *in_RSI - 8;
    *in_R9 = uVar2;
  }
  else {
    uVar2 = VP8LCheckSignature((uint8_t *)data_00,*in_RSI);
    *in_R9 = uVar2;
    *in_R8 = *in_RSI;
  }
  return VP8_STATUS_OK;
}

Assistant:

static VP8StatusCode ParseVP8Header(const uint8_t** const data_ptr,
                                    size_t* const data_size, int have_all_data,
                                    size_t riff_size, size_t* const chunk_size,
                                    int* const is_lossless) {
  const uint8_t* const data = *data_ptr;
  const int is_vp8 = !memcmp(data, "VP8 ", TAG_SIZE);
  const int is_vp8l = !memcmp(data, "VP8L", TAG_SIZE);
  const uint32_t minimal_size =
      TAG_SIZE + CHUNK_HEADER_SIZE;  // "WEBP" + "VP8 nnnn" OR
                                     // "WEBP" + "VP8Lnnnn"
  assert(data != NULL);
  assert(data_size != NULL);
  assert(chunk_size != NULL);
  assert(is_lossless != NULL);

  if (*data_size < CHUNK_HEADER_SIZE) {
    return VP8_STATUS_NOT_ENOUGH_DATA;  // Insufficient data.
  }

  if (is_vp8 || is_vp8l) {
    // Bitstream contains VP8/VP8L header.
    const uint32_t size = GetLE32(data + TAG_SIZE);
    if ((riff_size >= minimal_size) && (size > riff_size - minimal_size)) {
      return VP8_STATUS_BITSTREAM_ERROR;  // Inconsistent size information.
    }
    if (have_all_data && (size > *data_size - CHUNK_HEADER_SIZE)) {
      return VP8_STATUS_NOT_ENOUGH_DATA;  // Truncated bitstream.
    }
    // Skip over CHUNK_HEADER_SIZE bytes from VP8/VP8L Header.
    *chunk_size = size;
    *data_ptr += CHUNK_HEADER_SIZE;
    *data_size -= CHUNK_HEADER_SIZE;
    *is_lossless = is_vp8l;
  } else {
    // Raw VP8/VP8L bitstream (no header).
    *is_lossless = VP8LCheckSignature(data, *data_size);
    *chunk_size = *data_size;
  }

  return VP8_STATUS_OK;
}